

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O2

BarResponse * google::protobuf::DownCastMessage<proto2_unittest::BarResponse>(MessageLite *from)

{
  MessageLite *pMVar1;
  LogMessage *pLVar2;
  string_view sVar3;
  LogMessage local_20;
  
  pMVar1 = (MessageLite *)DynamicCastMessage<proto2_unittest::BarResponse>(from);
  if (pMVar1 == from) {
    return (BarResponse *)from;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.h"
             ,0x595,"DynamicCastMessage<T>(from) == from");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (&local_20,(char (*) [17])"Cannot downcast ");
  sVar3 = MessageLite::GetTypeName(from);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,sVar3);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,(char (*) [5])0x11473ca);
  sVar3 = MessageLite::GetTypeName((MessageLite *)&proto2_unittest::_BarResponse_default_instance_);
  absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,sVar3);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_20);
}

Assistant:

const T* DownCastMessage(const MessageLite* from) {
  internal::StrongReferenceToType<T>();
  ABSL_DCHECK(DynamicCastMessage<T>(from) == from)
      << "Cannot downcast " << from->GetTypeName() << " to "
      << T::default_instance().GetTypeName();
  return static_cast<const T*>(from);
}